

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void initMemory(vm *v)

{
  module *pmVar1;
  mem_pointer plVar2;
  data_pointer paVar3;
  size_t __n;
  byte *pbVar4;
  uint64 uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  module *module;
  
  pmVar1 = v->m;
  if ((pmVar1->mem_sec).mem_segment_count != 0) {
    plVar2 = (pmVar1->mem_sec).mem_segment_addr;
    (v->memory).limit = plVar2;
    uVar7 = (ulong)plVar2->min;
    (v->memory).pageCount = uVar7;
    pbVar4 = (byte *)malloc(uVar7 << 0x10);
    (v->memory).data = pbVar4;
    lVar6 = 0x20;
    for (uVar7 = 0; uVar7 < (pmVar1->data_sec).data_segment_count; uVar7 = uVar7 + 1) {
      paVar3 = (pmVar1->data_sec).data_segment_addr;
      execInst(v,(instruction *)((long)paVar3 + lVar6 + -0x18));
      uVar5 = popU64(&v->operandStack);
      __n = *(size_t *)((long)paVar3 + lVar6 + -8);
      if (__n + uVar5 <= (v->memory).pageCount << 0x10) {
        memcpy((v->memory).data + uVar5,*(void **)((long)&paVar3->mem + lVar6),__n);
      }
      lVar6 = lVar6 + 0x28;
    }
  }
  return;
}

Assistant:

void initMemory(vm *v) {
    if (v->m->mem_sec.mem_segment_count > 0) {
        memory *memory = &v->memory;
        module *module = v->m;
        memory->limit = module->mem_sec.mem_segment_addr;
        memory->pageCount = memory->limit->min;
        memory->data = malloc(memory->pageCount * PAGE_SIZE);
        /*写入数据段的内容*/
        for (int i = 0; i < module->data_sec.data_segment_count; ++i) {
            data_pointer d = module->data_sec.data_segment_addr + i;
            execInst(v, &d->offset);
            uint64 offset = popU64(&v->operandStack);
            write_memory(memory, offset, d->init_data, d->init_data_count);
        }
    }
}